

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.h
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::MacOSXContentGeneratorType::~MacOSXContentGeneratorType
          (MacOSXContentGeneratorType *this)

{
  MacOSXContentGeneratorType *this_local;
  
  ~MacOSXContentGeneratorType(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

MacOSXContentGeneratorType(cmNinjaTargetGenerator* g,
                               std::string fileConfig)
      : Generator(g)
      , FileConfig(std::move(fileConfig))
    {
    }